

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O3

void __thiscall
Ratio::Ratio(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *e,
            vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *f)

{
  pointer pPVar1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1_1;
  PhyloTreeEdge *e_1;
  pointer pPVar2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  double dVar3;
  double dVar4;
  
  pPVar1 = (e->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar3 = 0.0;
  for (pPVar2 = (e->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
                super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    dVar4 = PhyloTreeEdge::getLength(pPVar2);
    dVar3 = dVar3 + dVar4 * dVar4;
  }
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  this->eLength = dVar3;
  pPVar1 = (f->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar3 = 0.0;
  for (pPVar2 = (f->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
                super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    dVar4 = PhyloTreeEdge::getLength(pPVar2);
    dVar3 = dVar3 + dVar4 * dVar4;
  }
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  this->fLength = dVar3;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&this->eEdges,e);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&this->fEdges,f);
  return;
}

Assistant:

Ratio::Ratio(vector<PhyloTreeEdge>& e, vector<PhyloTreeEdge>& f) :
        eEdges(e), fEdges(f), eLength(geoAvg(e)), fLength(geoAvg(f)) {
}